

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O0

int __thiscall QTreeView::visualIndex(QTreeView *this,QModelIndex *index)

{
  int iVar1;
  QAbstractItemViewPrivate *in_RSI;
  QTreeViewPrivate *d;
  QModelIndex *in_stack_00000048;
  QTreeViewPrivate *in_stack_00000050;
  
  d_func((QTreeView *)0x900f1c);
  QAbstractItemViewPrivate::executePostedLayout(in_RSI);
  iVar1 = QTreeViewPrivate::viewIndex(in_stack_00000050,in_stack_00000048);
  return iVar1;
}

Assistant:

int QTreeView::visualIndex(const QModelIndex &index) const
{
    Q_D(const QTreeView);
    d->executePostedLayout();
    return d->viewIndex(index);
}